

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRF02.h
# Opt level: O2

int SendRangeRequestSRF02(SRF02 *pSRF02,int device)

{
  int iVar1;
  int iVar2;
  uint8 local_38 [40];
  
  if ((uint)device < 0x10) {
    iVar1 = SetSlaveComputerI2CBus
                      (pSRF02->I2CBus,pSRF02->addr[(uint)device],0,0,pSRF02->nbretries,
                       pSRF02->timeout);
    iVar2 = 1;
    if (iVar1 == 0) {
      local_38[8] = '\0';
      local_38[9] = '\0';
      local_38[10] = '\0';
      local_38[0xb] = '\0';
      local_38[0xc] = '\0';
      local_38[0xd] = '\0';
      local_38[0xe] = '\0';
      local_38[0xf] = '\0';
      local_38[0x10] = '\0';
      local_38[0x11] = '\0';
      local_38[0x12] = '\0';
      local_38[0x13] = '\0';
      local_38[0x14] = '\0';
      local_38[0x15] = '\0';
      local_38[0x16] = '\0';
      local_38[0x17] = '\0';
      local_38[0x18] = '\0';
      local_38[0x19] = '\0';
      local_38[0x1a] = '\0';
      local_38[0x1b] = '\0';
      local_38[0x1c] = '\0';
      local_38[0x1d] = '\0';
      local_38[0x1e] = '\0';
      local_38[0x1f] = '\0';
      local_38[0] = '\0';
      local_38[1] = 'Q';
      local_38[2] = '\0';
      local_38[3] = '\0';
      local_38[4] = '\0';
      local_38[5] = '\0';
      local_38[6] = '\0';
      local_38[7] = '\0';
      iVar1 = WriteAllComputerI2CBus(pSRF02->I2CBus,local_38,2);
      if (((iVar1 == 0) && (iVar2 = 0, pSRF02->bSaveRawData != 0)) &&
         ((FILE *)pSRF02->pfSaveFile != (FILE *)0x0)) {
        fwrite(local_38,2,1,(FILE *)pSRF02->pfSaveFile);
        fflush((FILE *)pSRF02->pfSaveFile);
      }
    }
  }
  else {
    puts("Error reading data from a SRF02 : Invalid parameter. ");
    iVar2 = 3;
  }
  return iVar2;
}

Assistant:

inline int SendRangeRequestSRF02(SRF02* pSRF02, int device)
{
	unsigned char sendbuf[MAX_NB_BYTES_SRF02];
	int sendbuflen = 0;

	if ((device < 0)||(device >= MAX_NB_DEVICES_SRF02))
	{
		printf("Error reading data from a SRF02 : Invalid parameter. \n");
		return EXIT_INVALID_PARAMETER;
	}

	if (SetSlaveComputerI2CBus(pSRF02->I2CBus, pSRF02->addr[device], 0, 0, pSRF02->nbretries, pSRF02->timeout) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sendbuf[0] = (unsigned char)COMMAND_REG_SRF02;
	sendbuf[1] = (unsigned char)REAL_RNG_CM_CMD_SRF02;
	sendbuflen = 2;

	if (WriteAllComputerI2CBus(pSRF02->I2CBus, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pSRF02->bSaveRawData)&&(pSRF02->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pSRF02->pfSaveFile);
		fflush(pSRF02->pfSaveFile);
	}

	return EXIT_SUCCESS;
}